

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

bool google::protobuf::compiler::java::HasRepeatedFields(Descriptor *descriptor)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  FieldDescriptor *this;
  int index;
  
  iVar2 = 0;
  do {
    index = iVar2;
    iVar1 = descriptor->field_count_;
    if (iVar1 <= index) break;
    this = Descriptor::field(descriptor,index);
    bVar3 = FieldDescriptor::is_repeated(this);
    iVar2 = index + 1;
  } while (!bVar3);
  return index < iVar1;
}

Assistant:

bool HasRepeatedFields(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    const FieldDescriptor* field = descriptor->field(i);
    if (field->is_repeated()) {
      return true;
    }
  }
  return false;
}